

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestCoverageHandler.cxx
# Opt level: O0

bool __thiscall
cmCTestCoverageHandler::ShouldIDoCoverage
          (cmCTestCoverageHandler *this,string *file,string *srcDir,string *binDir)

{
  cmCTest *pcVar1;
  bool bVar2;
  bool bVar3;
  __type _Var4;
  reference this_00;
  ulong uVar5;
  ulong uVar6;
  ostream *poVar7;
  char *pcVar8;
  string local_708 [32];
  undefined1 local_6e8 [8];
  ostringstream cmCTestLog_msg_2;
  allocator<char> local_569;
  string local_568;
  string local_548;
  string local_528;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_508;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4e8;
  string local_4c8;
  undefined1 local_4a8 [8];
  string relPath;
  string local_480 [32];
  undefined1 local_460 [8];
  ostringstream cmCTestLog_msg_1;
  allocator<char> local_2e1;
  string local_2e0;
  undefined1 local_2c0 [8];
  string ndc;
  string checkDir;
  string fileDir;
  undefined1 local_258 [6];
  bool buildSubDir;
  bool sourceSubDir;
  string fFile;
  string fBinDir;
  string fSrcDir;
  ostringstream local_1c8 [8];
  ostringstream cmCTestLog_msg;
  RegularExpression *rx;
  iterator __end1;
  iterator __begin1;
  vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_> *__range1;
  string *binDir_local;
  string *srcDir_local;
  string *file_local;
  cmCTestCoverageHandler *this_local;
  
  bVar2 = IsFilteredOut(this,file);
  if (bVar2) {
    this_local._7_1_ = false;
  }
  else {
    __end1 = std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>::begin
                       (&this->CustomCoverageExcludeRegex);
    rx = (RegularExpression *)
         std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>::end
                   (&this->CustomCoverageExcludeRegex);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<cmsys::RegularExpression_*,_std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>_>
                                       *)&rx), bVar2) {
      this_00 = __gnu_cxx::
                __normal_iterator<cmsys::RegularExpression_*,_std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>_>
                ::operator*(&__end1);
      bVar2 = cmsys::RegularExpression::find(this_00,file);
      if (bVar2) {
        std::__cxx11::ostringstream::ostringstream(local_1c8);
        poVar7 = std::operator<<((ostream *)local_1c8,"  File ");
        poVar7 = std::operator<<(poVar7,(string *)file);
        poVar7 = std::operator<<(poVar7," is excluded in CTestCustom.ctest");
        std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
        pcVar1 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::ostringstream::str();
        pcVar8 = (char *)std::__cxx11::string::c_str();
        cmCTest::Log(pcVar1,5,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestCoverageHandler.cxx"
                     ,0xca,pcVar8,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
        std::__cxx11::string::~string((string *)(fSrcDir.field_2._M_local_buf + 8));
        std::__cxx11::ostringstream::~ostringstream(local_1c8);
        return false;
      }
      __gnu_cxx::
      __normal_iterator<cmsys::RegularExpression_*,_std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>_>
      ::operator++(&__end1);
    }
    cmsys::SystemTools::CollapseFullPath((string *)((long)&fBinDir.field_2 + 8),srcDir);
    cmsys::SystemTools::CollapseFullPath((string *)((long)&fFile.field_2 + 8),binDir);
    cmsys::SystemTools::CollapseFullPath((string *)local_258,file);
    bVar2 = cmsys::SystemTools::IsSubDirectory
                      ((string *)local_258,(string *)((long)&fBinDir.field_2 + 8));
    bVar3 = cmsys::SystemTools::IsSubDirectory
                      ((string *)local_258,(string *)((long)&fFile.field_2 + 8));
    cmsys::SystemTools::GetFilenamePath((string *)((long)&checkDir.field_2 + 8),(string *)local_258)
    ;
    std::__cxx11::string::string((string *)(ndc.field_2._M_local_buf + 8));
    if ((bVar2) && (bVar3)) {
      uVar5 = std::__cxx11::string::size();
      uVar6 = std::__cxx11::string::size();
      if (uVar6 < uVar5) {
        std::__cxx11::string::operator=
                  ((string *)(ndc.field_2._M_local_buf + 8),
                   (string *)(fBinDir.field_2._M_local_buf + 8));
      }
      else {
        std::__cxx11::string::operator=
                  ((string *)(ndc.field_2._M_local_buf + 8),
                   (string *)(fFile.field_2._M_local_buf + 8));
      }
    }
    else if (bVar2) {
      std::__cxx11::string::operator=
                ((string *)(ndc.field_2._M_local_buf + 8),
                 (string *)(fBinDir.field_2._M_local_buf + 8));
    }
    else if (bVar3) {
      std::__cxx11::string::operator=
                ((string *)(ndc.field_2._M_local_buf + 8),(string *)(fFile.field_2._M_local_buf + 8)
                );
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2e0,".NoDartCoverage",&local_2e1);
    cmSystemTools::FileExistsInParentDirectories
              ((string *)local_2c0,&local_2e0,(string *)local_258,(string *)((long)&ndc.field_2 + 8)
              );
    std::__cxx11::string::~string((string *)&local_2e0);
    std::allocator<char>::~allocator(&local_2e1);
    uVar5 = std::__cxx11::string::empty();
    if ((uVar5 & 1) == 0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_460);
      poVar7 = std::operator<<((ostream *)local_460,"Found: ");
      poVar7 = std::operator<<(poVar7,(string *)local_2c0);
      poVar7 = std::operator<<(poVar7," so skip coverage of ");
      poVar7 = std::operator<<(poVar7,(string *)file);
      std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
      pcVar1 = (this->super_cmCTestGenericHandler).CTest;
      std::__cxx11::ostringstream::str();
      pcVar8 = (char *)std::__cxx11::string::c_str();
      cmCTest::Log(pcVar1,5,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestCoverageHandler.cxx"
                   ,0xea,pcVar8,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
      std::__cxx11::string::~string(local_480);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_460);
      this_local._7_1_ = false;
      relPath.field_2._12_4_ = 1;
    }
    else {
      std::__cxx11::string::string((string *)local_4a8);
      uVar5 = std::__cxx11::string::empty();
      if ((uVar5 & 1) == 0) {
        cmSystemTools::RelativePath
                  (&local_4c8,(string *)((long)&ndc.field_2 + 8),(string *)local_258);
        std::__cxx11::string::operator=((string *)local_4a8,(string *)&local_4c8);
        std::__cxx11::string::~string((string *)&local_4c8);
      }
      else {
        std::__cxx11::string::operator=((string *)local_4a8,(string *)local_258);
      }
      _Var4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              ((long)&ndc.field_2 + 8),
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              ((long)&fBinDir.field_2 + 8));
      if (_Var4) {
        std::__cxx11::string::operator=
                  ((string *)(ndc.field_2._M_local_buf + 8),
                   (string *)(fFile.field_2._M_local_buf + 8));
      }
      else {
        std::__cxx11::string::operator=
                  ((string *)(ndc.field_2._M_local_buf + 8),
                   (string *)(fBinDir.field_2._M_local_buf + 8));
      }
      std::operator+(&local_508,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&ndc.field_2 + 8),"/");
      std::operator+(&local_4e8,&local_508,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4a8)
      ;
      std::__cxx11::string::operator=((string *)local_258,(string *)&local_4e8);
      std::__cxx11::string::~string((string *)&local_4e8);
      std::__cxx11::string::~string((string *)&local_508);
      cmsys::SystemTools::GetFilenamePath(&local_528,(string *)local_258);
      std::__cxx11::string::operator=((string *)local_258,(string *)&local_528);
      std::__cxx11::string::~string((string *)&local_528);
      _Var4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              ((long)&checkDir.field_2 + 8),
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_258);
      if (_Var4) {
        this_local._7_1_ = true;
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_568,".NoDartCoverage",&local_569);
        cmSystemTools::FileExistsInParentDirectories
                  (&local_548,&local_568,(string *)local_258,(string *)((long)&ndc.field_2 + 8));
        std::__cxx11::string::operator=((string *)local_2c0,(string *)&local_548);
        std::__cxx11::string::~string((string *)&local_548);
        std::__cxx11::string::~string((string *)&local_568);
        std::allocator<char>::~allocator(&local_569);
        uVar5 = std::__cxx11::string::empty();
        if ((uVar5 & 1) == 0) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_6e8);
          poVar7 = std::operator<<((ostream *)local_6e8,"Found: ");
          poVar7 = std::operator<<(poVar7,(string *)local_2c0);
          poVar7 = std::operator<<(poVar7," so skip coverage of: ");
          poVar7 = std::operator<<(poVar7,(string *)file);
          std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
          pcVar1 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::ostringstream::str();
          pcVar8 = (char *)std::__cxx11::string::c_str();
          cmCTest::Log(pcVar1,5,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestCoverageHandler.cxx"
                       ,0x10a,pcVar8,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
          std::__cxx11::string::~string(local_708);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_6e8);
          this_local._7_1_ = false;
        }
        else {
          this_local._7_1_ = true;
        }
      }
      relPath.field_2._12_4_ = 1;
      std::__cxx11::string::~string((string *)local_4a8);
    }
    std::__cxx11::string::~string((string *)local_2c0);
    std::__cxx11::string::~string((string *)(ndc.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(checkDir.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)local_258);
    std::__cxx11::string::~string((string *)(fFile.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(fBinDir.field_2._M_local_buf + 8));
  }
  return this_local._7_1_;
}

Assistant:

bool cmCTestCoverageHandler::ShouldIDoCoverage(std::string const& file,
                                               std::string const& srcDir,
                                               std::string const& binDir)
{
  if (this->IsFilteredOut(file)) {
    return false;
  }

  for (cmsys::RegularExpression& rx : this->CustomCoverageExcludeRegex) {
    if (rx.find(file)) {
      cmCTestOptionalLog(
        this->CTest, HANDLER_VERBOSE_OUTPUT,
        "  File " << file << " is excluded in CTestCustom.ctest" << std::endl;
        , this->Quiet);
      return false;
    }
  }

  std::string fSrcDir = cmSystemTools::CollapseFullPath(srcDir);
  std::string fBinDir = cmSystemTools::CollapseFullPath(binDir);
  std::string fFile = cmSystemTools::CollapseFullPath(file);
  bool sourceSubDir = cmSystemTools::IsSubDirectory(fFile, fSrcDir);
  bool buildSubDir = cmSystemTools::IsSubDirectory(fFile, fBinDir);
  // Always check parent directory of the file.
  std::string fileDir = cmSystemTools::GetFilenamePath(fFile);
  std::string checkDir;

  // We also need to check the binary/source directory pair.
  if (sourceSubDir && buildSubDir) {
    if (fSrcDir.size() > fBinDir.size()) {
      checkDir = fSrcDir;
    } else {
      checkDir = fBinDir;
    }
  } else if (sourceSubDir) {
    checkDir = fSrcDir;
  } else if (buildSubDir) {
    checkDir = fBinDir;
  }
  std::string ndc = cmSystemTools::FileExistsInParentDirectories(
    ".NoDartCoverage", fFile, checkDir);
  if (!ndc.empty()) {
    cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                       "Found: " << ndc << " so skip coverage of " << file
                                 << std::endl,
                       this->Quiet);
    return false;
  }

  // By now checkDir should be set to parent directory of the file.
  // Get the relative path to the file an apply it to the opposite directory.
  // If it is the same as fileDir, then ignore, otherwise check.
  std::string relPath;
  if (!checkDir.empty()) {
    relPath = cmSystemTools::RelativePath(checkDir, fFile);
  } else {
    relPath = fFile;
  }
  if (checkDir == fSrcDir) {
    checkDir = fBinDir;
  } else {
    checkDir = fSrcDir;
  }
  fFile = checkDir + "/" + relPath;
  fFile = cmSystemTools::GetFilenamePath(fFile);

  if (fileDir == fFile) {
    // This is in-source build, so we trust the previous check.
    return true;
  }

  ndc = cmSystemTools::FileExistsInParentDirectories(".NoDartCoverage", fFile,
                                                     checkDir);
  if (!ndc.empty()) {
    cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                       "Found: " << ndc << " so skip coverage of: " << file
                                 << std::endl,
                       this->Quiet);
    return false;
  }
  // Ok, nothing in source tree, nothing in binary tree
  return true;
}